

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathVec.h
# Opt level: O3

Vec3<float> __thiscall Imath_2_5::Vec3<float>::normalized(Vec3<float> *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Vec3<float> *in_RSI;
  float fVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  Vec3<float> VVar9;
  undefined4 extraout_XMM0_Db;
  
  fVar3 = in_RSI->z * in_RSI->z + in_RSI->x * in_RSI->x + in_RSI->y * in_RSI->y;
  if (2.3509887e-38 <= fVar3) {
    uVar4 = (ulong)(uint)SQRT(fVar3);
  }
  else {
    fVar3 = lengthTiny(in_RSI);
    uVar4 = CONCAT44(extraout_XMM0_Db,fVar3);
  }
  uVar5 = 0;
  fVar8 = 0.0;
  fVar3 = (float)uVar4;
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    uVar1 = in_RSI->x;
    uVar2 = in_RSI->y;
    auVar6._4_4_ = uVar2;
    auVar6._0_4_ = uVar1;
    auVar6._8_8_ = 0;
    auVar7._4_4_ = fVar3;
    auVar7._0_4_ = fVar3;
    auVar7._8_4_ = fVar3;
    auVar7._12_4_ = fVar3;
    auVar7 = divps(auVar6,auVar7);
    uVar5 = auVar7._0_8_;
    fVar8 = in_RSI->z / fVar3;
  }
  this->z = fVar8;
  this->x = (float)(int)uVar5;
  this->y = (float)(int)((ulong)uVar5 >> 0x20);
  VVar9.z = (float)uVar5;
  VVar9.x = (float)(int)uVar4;
  VVar9.y = (float)(int)(uVar4 >> 0x20);
  return VVar9;
}

Assistant:

Vec3<T>
Vec3<T>::normalized () const
{
    T l = length();

    if (l == T (0))
	return Vec3 (T (0));

    return Vec3 (x / l, y / l, z / l);
}